

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledRgbaInputFile::readTile(TiledRgbaInputFile *this,int dx,int dy,int lx,int ly)

{
  Lock local_38;
  
  local_38._mutex = &this->_fromYa->super_Mutex;
  if ((FromYa *)local_38._mutex != (FromYa *)0x0) {
    std::mutex::lock(local_38._mutex);
    local_38._locked = true;
    FromYa::readTile(this->_fromYa,dx,dy,lx,ly);
    IlmThread_2_5::Lock::~Lock(&local_38);
    return;
  }
  TiledInputFile::readTile(this->_inputFile,dx,dy,lx,ly);
  return;
}

Assistant:

void
TiledRgbaInputFile::readTile (int dx, int dy, int lx, int ly)
{
    if (_fromYa)
    {
	Lock lock (*_fromYa);
	_fromYa->readTile (dx, dy, lx, ly);
    }
    else
    {
	 _inputFile->readTile (dx, dy, lx, ly);
    }
}